

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void soul::ResolutionPass::FunctionResolver::findLeastMisspeltFunction
               (Scope *scope,string *name,string *nearest,size_t *lowestDistance)

{
  int iVar1;
  undefined4 extraout_var;
  string *psVar3;
  size_t sVar4;
  undefined4 extraout_var_00;
  long *extraout_RDX;
  long *extraout_RDX_00;
  pool_ref<soul::AST::ModuleBase> *sub;
  string functionName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_88;
  long *plVar2;
  
  iVar1 = (*scope->_vptr_Scope[0xd])();
  for (plVar2 = (long *)CONCAT44(extraout_var,iVar1); plVar2 != extraout_RDX; plVar2 = plVar2 + 1) {
    psVar3 = Identifier::toString_abi_cxx11_((Identifier *)(*plVar2 + 0x38));
    std::__cxx11::string::string((string *)&local_e8,(string *)psVar3);
    sVar4 = choc::text::getLevenshteinDistance<std::__cxx11::string>(name,&local_e8);
    if (sVar4 < *lowestDistance) {
      *lowestDistance = sVar4;
      (*scope->_vptr_Scope[2])(&local_88);
      IdentifierPath::toString_abi_cxx11_(&local_c8,(IdentifierPath *)&local_88);
      TokenisedPathString::join(&local_a8,&local_c8,&local_e8);
      std::__cxx11::string::operator=((string *)nearest,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_88);
    }
    std::__cxx11::string::~string((string *)&local_e8);
  }
  iVar1 = (*scope->_vptr_Scope[0x11])();
  for (plVar2 = (long *)CONCAT44(extraout_var_00,iVar1); plVar2 != extraout_RDX_00;
      plVar2 = plVar2 + 1) {
    findLeastMisspeltFunction((Scope *)(*plVar2 + 0x28),name,nearest,lowestDistance);
  }
  return;
}

Assistant:

static void findLeastMisspeltFunction (AST::Scope& scope, const std::string& name, std::string& nearest, size_t& lowestDistance)
        {
            for (auto& f : scope.getFunctions())
            {
                auto functionName = f->name.toString();
                auto distance = choc::text::getLevenshteinDistance (name, functionName);

                if (distance < lowestDistance)
                {
                    lowestDistance = distance;
                    nearest = TokenisedPathString::join (scope.getFullyQualifiedPath().toString(), functionName);
                }
            }

            for (auto& sub : scope.getSubModules())
                findLeastMisspeltFunction (sub, name, nearest, lowestDistance);
        }